

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

logical gai_check_ghost_distr(Integer g_a)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1._0_2_ = GA[g_a + 1000].ndim;
  uVar1._2_2_ = GA[g_a + 1000].irreg;
  uVar2 = 0;
  uVar3 = (ulong)uVar1;
  if ((short)(undefined2)uVar1 < 1) {
    uVar3 = uVar2;
  }
  lVar4 = 0;
  do {
    if (uVar2 == (uVar3 & 0xffff)) {
      return 1;
    }
    uVar1 = GA[g_a + 1000].nblock[uVar2];
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      if ((long)uVar6 < (long)(int)uVar1 + -1) {
        if ((GA[g_a + 1000].mapc[lVar4 + uVar6 + 1] - GA[g_a + 1000].mapc[lVar4 + uVar6]) + 1 <
            GA[g_a + 1000].width[uVar2]) {
          return 0;
        }
      }
      else if ((GA[g_a + 1000].dims[uVar2] - GA[g_a + 1000].mapc[lVar4 + uVar6]) + 1 <
               GA[g_a + 1000].width[uVar2]) {
        return 0;
      }
    }
    uVar2 = uVar2 + 1;
    lVar4 = lVar4 + uVar5;
  } while( true );
}

Assistant:

static logical gai_check_ghost_distr(Integer g_a)
{
  Integer handle=GA_OFFSET + g_a;
  Integer idx, ndim, np, ipx;
  ndim = GA[handle].ndim;
  ipx = 0;
  for (idx = 0; idx < ndim; idx++) {
    for (np = 0; np < GA[handle].nblock[idx]; np++) {
      if (np < GA[handle].nblock[idx] - 1) {
        if (GA[handle].mapc[ipx+1]-GA[handle].mapc[ipx]+1
            <GA[handle].width[idx]) {
          return FALSE;
        }
      } else {
        if (GA[handle].dims[idx]-GA[handle].mapc[ipx]+1
            <GA[handle].width[idx]) {
          return FALSE;
        }
      }
      ipx++;
    }
  }
  return TRUE;
}